

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

bstring blk2bstr(void *blk,int len)

{
  int iVar1;
  void *pvVar2;
  int i;
  bstring b;
  int len_local;
  void *blk_local;
  
  if ((blk == (void *)0x0) || (len < 0)) {
    blk_local = (void *)0x0;
  }
  else {
    blk_local = malloc(0x10);
    if ((int *)blk_local == (int *)0x0) {
      blk_local = (void *)0x0;
    }
    else {
      *(int *)((long)blk_local + 4) = len;
      iVar1 = snapUpSize(len + (2 - (uint)(len != 0)));
      *(int *)blk_local = iVar1;
      pvVar2 = malloc((long)*blk_local);
      *(void **)((long)blk_local + 8) = pvVar2;
      if (*(long *)((long)blk_local + 8) == 0) {
        free(blk_local);
        blk_local = (void *)0x0;
      }
      else {
        if (0 < len) {
          memcpy(*(void **)((long)blk_local + 8),blk,(long)len);
        }
        *(undefined1 *)(*(long *)((long)blk_local + 8) + (long)len) = 0;
      }
    }
  }
  return (bstring)blk_local;
}

Assistant:

bstring blk2bstr (const void * blk, int len) {
bstring b;
int i;

	if (blk == NULL || len < 0) return NULL;
	b = (bstring) bstr__alloc (sizeof (struct tagbstring));
	if (b == NULL) return NULL;
	b->slen = len;

	i = len + (2 - (len != 0));
	i = snapUpSize (i);

	b->mlen = i;

	b->data = (unsigned char *) bstr__alloc (b->mlen);
	if (b->data == NULL) {
		bstr__free (b);
		return NULL;
	}

	if (len > 0) bstr__memcpy (b->data, blk, len);
	b->data[len] = (unsigned char) '\0';

	return b;
}